

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O0

void __thiscall
BailOutRecord::RestoreValues
          (BailOutRecord *this,BailOutKind bailOutKind,JavascriptCallStackLayout *layout,uint count,
          int *offsets,int argOutSlotStart,Var *values,ScriptContext *scriptContext,
          bool fromLoopBody,Var *registerSaves,InterpreterStackFrame *newInstance,
          Var *pArgumentsObject,void *argoutRestoreAddress)

{
  anon_class_80_10_a3a5b79e callback;
  bool local_ba;
  bool local_b9;
  int local_b8;
  bool isInt32;
  uint uStack_b4;
  bool isFloat64;
  int offset;
  uint i;
  BailOutKind BStack_a8;
  undefined4 uStack_a4;
  JavascriptCallStackLayout *local_a0;
  Var *ppvStack_98;
  ScriptContext *local_90;
  undefined1 uStack_88;
  undefined7 uStack_87;
  Var *local_80;
  InterpreterStackFrame *pIStack_78;
  Var *local_70;
  void *pvStack_68;
  undefined1 local_5e;
  byte local_5d;
  int local_5c;
  bool isLocal;
  bool fromLoopBody_local;
  int *piStack_58;
  int argOutSlotStart_local;
  int *offsets_local;
  JavascriptCallStackLayout *pJStack_48;
  uint count_local;
  JavascriptCallStackLayout *layout_local;
  BailOutRecord *pBStack_38;
  BailOutKind bailOutKind_local;
  BailOutRecord *this_local;
  
  local_5d = fromLoopBody;
  local_5e = offsets == (int *)0x0;
  local_5c = argOutSlotStart;
  piStack_58 = offsets;
  offsets_local._4_4_ = count;
  pJStack_48 = layout;
  layout_local._4_4_ = bailOutKind;
  pBStack_38 = this;
  if ((bool)local_5e) {
    ppvStack_98 = values;
    local_90 = scriptContext;
    uStack_88 = fromLoopBody;
    local_80 = registerSaves;
    pIStack_78 = newInstance;
    local_70 = pArgumentsObject;
    pvStack_68 = argoutRestoreAddress;
    callback._12_4_ = uStack_a4;
    callback.bailOutKind = bailOutKind;
    callback.this = this;
    callback.layout = layout;
    callback.values = values;
    callback.scriptContext._0_4_ = (int)scriptContext;
    callback.scriptContext._4_4_ = (int)((ulong)scriptContext >> 0x20);
    callback._40_4_ = (int)CONCAT71(uStack_87,fromLoopBody);
    callback._44_4_ = (int)((uint7)uStack_87 >> 0x18);
    callback.registerSaves._0_4_ = (int)registerSaves;
    callback.registerSaves._4_4_ = (int)((ulong)registerSaves >> 0x20);
    callback.newInstance._0_4_ = (int)newInstance;
    callback.newInstance._4_4_ = (int)((ulong)newInstance >> 0x20);
    callback.pArgumentsObject._0_4_ = (int)pArgumentsObject;
    callback.pArgumentsObject._4_4_ = (int)((ulong)pArgumentsObject >> 0x20);
    callback.argoutRestoreAddress = argoutRestoreAddress;
    _offset = this;
    BStack_a8 = bailOutKind;
    local_a0 = layout;
    GlobalBailOutRecordDataTable::
    IterateGlobalBailOutRecordTableRows<BailOutRecord::RestoreValues(IR::BailOutKind,Js::JavascriptCallStackLayout*,unsigned_int,int*,int,void**,Js::ScriptContext*,bool,void**,Js::InterpreterStackFrame*,void**,void*)const::__0>
              (this->globalBailOutRecordTable,this->m_bailOutRecordId,callback);
  }
  else {
    for (uStack_b4 = 0; uStack_b4 < offsets_local._4_4_; uStack_b4 = uStack_b4 + 1) {
      local_b8 = piStack_58[uStack_b4];
      IsOffsetNativeIntOrFloat(this,uStack_b4,local_5c,&local_b9,&local_ba);
      RestoreValue(this,layout_local._4_4_,pJStack_48,values,scriptContext,(bool)(local_5d & 1),
                   registerSaves,newInstance,pArgumentsObject,argoutRestoreAddress,uStack_b4,
                   local_b8,false,(bool)(local_b9 & 1),(bool)(local_ba & 1));
    }
  }
  return;
}

Assistant:

void
BailOutRecord::RestoreValues(IR::BailOutKind bailOutKind, Js::JavascriptCallStackLayout * layout, uint count, __in_ecount_opt(count) int * offsets, int argOutSlotStart,
    __out_ecount(count) Js::Var * values, Js::ScriptContext * scriptContext,
    bool fromLoopBody, Js::Var * registerSaves, Js::InterpreterStackFrame * newInstance, Js::Var* pArgumentsObject, void * argoutRestoreAddress) const
{
    bool isLocal = offsets == nullptr;

    if (isLocal == true)
    {
        globalBailOutRecordTable->IterateGlobalBailOutRecordTableRows(m_bailOutRecordId, [=](GlobalBailOutRecordDataRow *row) {
            Assert(row->offset != 0);
            RestoreValue(bailOutKind, layout, values, scriptContext, fromLoopBody, registerSaves, newInstance, pArgumentsObject,
                argoutRestoreAddress, row->regSlot, row->offset, true, row->isFloat, row->isInt);
        });
    }
    else
    {
        for (uint i = 0; i < count; i++)
        {
            int offset = 0;

            // The variables below determine whether we have a Var or native float/int.
            bool isFloat64;
            bool isInt32;

            offset = offsets[i];
            this->IsOffsetNativeIntOrFloat(i, argOutSlotStart, &isFloat64, &isInt32);
#ifdef _M_IX86
            if (this->argOutOffsetInfo->isOrphanedArgSlot->Test(argOutSlotStart + i))
            {
                RestoreValue(bailOutKind, layout, values, scriptContext, fromLoopBody, registerSaves, newInstance, pArgumentsObject,
                    nullptr, i, offset, /* isLocal */ true, isFloat64, isInt32);
                continue;
            }
#endif
            RestoreValue(bailOutKind, layout, values, scriptContext, fromLoopBody, registerSaves, newInstance, pArgumentsObject,
                         argoutRestoreAddress, i, offset, false, isFloat64, isInt32);
        }
    }
}